

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O3

void ecc_montgomery_curve_free(MontgomeryCurve *mc)

{
  mp_free(mc->p);
  mp_free(mc->a);
  mp_free(mc->b);
  mp_free(mc->aplus2over4);
  monty_free(mc->mc);
  safefree(mc);
  return;
}

Assistant:

void ecc_montgomery_curve_free(MontgomeryCurve *mc)
{
    mp_free(mc->p);
    mp_free(mc->a);
    mp_free(mc->b);
    mp_free(mc->aplus2over4);
    monty_free(mc->mc);
    sfree(mc);
}